

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

int lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  ulong uVar1;
  undefined4 in_ECX;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  global_State *g;
  undefined1 local_14;
  undefined8 local_10;
  
  uVar1 = (ulong)*(uint *)(in_RDI + 8);
  local_14 = in_DL & 0xf;
  if ((in_RSI == 0) || (local_10 = in_RSI, local_14 == 0)) {
    local_14 = 0;
    local_10 = 0;
  }
  *(long *)(uVar1 + 0x168) = local_10;
  *(undefined4 *)(uVar1 + 0x164) = in_ECX;
  *(undefined4 *)(uVar1 + 0x10c) = in_ECX;
  *(byte *)(uVar1 + 0x109) = *(byte *)(uVar1 + 0x109) & 0xf0 | local_14;
  *(uint *)(uVar1 + 0x31c) = *(uint *)(uVar1 + 0x31c) & 0xffffffef;
  lj_dispatch_update((global_State *)L);
  return 1;
}

Assistant:

LUA_API int lua_sethook(lua_State *L, lua_Hook func, int mask, int count)
{
  global_State *g = G(L);
  mask &= HOOK_EVENTMASK;
  if (func == NULL || mask == 0) { mask = 0; func = NULL; }  /* Consistency. */
  g->hookf = func;
  g->hookcount = g->hookcstart = (int32_t)count;
  g->hookmask = (uint8_t)((g->hookmask & ~HOOK_EVENTMASK) | mask);
  lj_trace_abort(g);  /* Abort recording on any hook change. */
  lj_dispatch_update(g);
  return 1;
}